

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PosTagger.hpp
# Opt level: O2

string * __thiscall
cppjieba::PosTagger::LookupTag
          (string *__return_storage_ptr__,PosTagger *this,string *str,SegmentTagged *segment)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  DictUnit *pDVar3;
  char *__s;
  RuneStrArray runes;
  Logger local_1a8;
  
  memset(&runes,0,0x140);
  runes.size_ = 0;
  runes.capacity_ = 0x10;
  runes.ptr_ = runes.buffer_;
  iVar2 = (*(segment->super_SegmentBase)._vptr_SegmentBase[4])(segment);
  if ((DictTrie *)CONCAT44(extraout_var,iVar2) != (DictTrie *)0x0) {
    bVar1 = DecodeRunesInString(str,&runes);
    if (bVar1) {
      pDVar3 = DictTrie::Find((DictTrie *)CONCAT44(extraout_var,iVar2),runes.ptr_,
                              runes.ptr_ + runes.size_);
      if ((pDVar3 == (DictUnit *)0x0) || ((pDVar3->tag)._M_string_length == 0)) {
        __s = SpecialRule(this,&runes);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,__s,(allocator<char> *)&local_1a8);
      }
      else {
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&pDVar3->tag);
      }
    }
    else {
      limonp::Logger::Logger
                (&local_1a8,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hscspring[P]cppjieba/include/cppjieba/PosTagger.hpp"
                 ,0x26);
      std::operator<<((ostream *)&local_1a8,"Decode failed.");
      limonp::Logger::~Logger(&local_1a8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"x",(allocator<char> *)&local_1a8);
    }
    limonp::LocalVector<cppjieba::RuneStr>::~LocalVector(&runes);
    return __return_storage_ptr__;
  }
  __assert_fail("dict != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/hscspring[P]cppjieba/include/cppjieba/PosTagger.hpp"
                ,0x24,
                "string cppjieba::PosTagger::LookupTag(const string &, const SegmentTagged &) const"
               );
}

Assistant:

string LookupTag(const string &str, const SegmentTagged& segment) const {
    const DictUnit *tmp = NULL;
    RuneStrArray runes;
    const DictTrie * dict = segment.GetDictTrie();
    assert(dict != NULL);
      if (!DecodeRunesInString(str, runes)) {
        XLOG(ERROR) << "Decode failed.";
        return POS_X;
      }
      tmp = dict->Find(runes.begin(), runes.end());
      if (tmp == NULL || tmp->tag.empty()) {
        return SpecialRule(runes);
      } else {
        return tmp->tag;
      }
  }